

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O2

void erase(FT_HANDLE ftHandle)

{
  int iVar1;
  ostream *poVar2;
  
  std::operator<<((ostream *)&std::cout,"Erasing... ");
  iVar1 = FT_EraseEE(ftHandle);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in erasing device!");
    std::endl<char,std::char_traits<char>>(poVar2);
    FT_Close(ftHandle);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Done.");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void erase(FT_HANDLE ftHandle) {
    cout << "Erasing... ";
    FT_STATUS ftStatus = FT_EraseEE(ftHandle);
    if (ftStatus != FT_OK) // Did the command execute OK?
    {
        cerr << "Error in erasing device!" << endl;
        FT_Close(ftHandle);
        return;
    }
    cout << "Done." << endl;
}